

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O1

void __thiscall
CMU462::DynamicScene::Joint::drag
          (Joint *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  long lVar2;
  Matrix4x4 *pMVar3;
  Matrix4x4 *pMVar4;
  Joint *j;
  Joint *pJVar5;
  byte bVar6;
  Vector4D q;
  Matrix4x4 T;
  Vector4D local_1d8;
  Matrix4x4 local_1b0;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  bVar6 = 0;
  local_1d8.x = (this->super_SceneObject).position.x;
  local_1d8.y = (this->super_SceneObject).position.y;
  local_1d8.z = (this->super_SceneObject).position.z;
  local_1d8.w = 1.0;
  Matrix4x4::operator*(modelViewProj,&local_1d8);
  dVar1 = 1.0 / local_130.entries[0].w;
  local_1d8.x = (local_130.entries[0].x * dVar1 + dx) * local_130.entries[0].w;
  local_1d8.y = (local_130.entries[0].y * dVar1 + dy) * local_130.entries[0].w;
  local_1d8.z = dVar1 * local_130.entries[0].z * local_130.entries[0].w;
  local_1d8.w = local_130.entries[0].w * dVar1 * local_130.entries[0].w;
  Matrix4x4::inv(&local_130,modelViewProj);
  Matrix4x4::operator*(&local_130,&local_1d8);
  local_1d8.z = local_1b0.entries[0].z;
  local_1d8.w = local_1b0.entries[0].w;
  local_1d8.x = local_1b0.entries[0].x;
  local_1d8.y = local_1b0.entries[0].y;
  Matrix4x4::identity();
  pJVar5 = this;
  do {
    (*(pJVar5->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0,pJVar5);
    Matrix4x4::operator*(&local_1b0,&local_b0,&local_130);
    pMVar3 = &local_1b0;
    pMVar4 = &local_130;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pMVar4->entries[0].x = pMVar3->entries[0].x;
      pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    pJVar5 = pJVar5->parent;
  } while (pJVar5 != (Joint *)0x0);
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0);
  Matrix4x4::operator*(&local_1b0,&local_b0,&local_130);
  pMVar3 = &local_1b0;
  pMVar4 = &local_130;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pMVar4->entries[0].x = pMVar3->entries[0].x;
    pMVar3 = (Matrix4x4 *)((long)pMVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  Matrix4x4::inv(&local_1b0,&local_130);
  Matrix4x4::operator*(&local_1b0,&local_1d8);
  local_1d8.z = local_b0.entries[0].z;
  local_1d8.w = local_b0.entries[0].w;
  local_1d8.x = local_b0.entries[0].x;
  local_1d8.y = local_b0.entries[0].y;
  if (this->skeleton->root == this) {
    Vector4D::to3D(&local_1d8);
    (this->super_SceneObject).position.z = local_1b0.entries[0].z;
    (this->super_SceneObject).position.x = local_1b0.entries[0].x;
    (this->super_SceneObject).position.y = local_1b0.entries[0].y;
  }
  else {
    Vector4D::to3D(&local_1d8);
    (this->axis).x = local_1b0.entries[0].x + (this->axis).x;
    (this->axis).y = local_1b0.entries[0].y + (this->axis).y;
    (this->axis).z = local_1b0.entries[0].z + (this->axis).z;
  }
  return;
}

Assistant:

void Joint::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
   {
      Vector4D q(position, 1.);

      // Transform into clip space
      q = modelViewProj * q;
      double w = q.w;
      q /= w;

      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;

      // Transform back into model space
      q *= w;
      q = modelViewProj.inv() * q;

      Matrix4x4 T = Matrix4x4::identity();
      for (Joint* j = this; j != nullptr; j = j->parent)
      {
          T = j->getRotation() * T;
      }
      T = skeleton->mesh->getRotation() * T;
      q = T.inv() * q;

      if (skeleton->root == this)
         position = q.to3D();
      else
         axis += q.to3D();
   }